

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int iVar55;
  int iVar56;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar57;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [64];
  vint4 bi;
  vint4 bi_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi_1;
  undefined1 auVar61 [16];
  vint4 ai_1;
  vint4 ai_3;
  vint4 ai;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1088 [16];
  Intersectors *local_1070;
  size_t local_1068;
  Precalculations *local_1060;
  RayHitK<4> *local_1058;
  undefined1 (*local_1050) [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 local_1028;
  undefined4 uStack_1024;
  undefined4 uStack_1020;
  undefined4 uStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1060 = pre;
  local_1070 = This;
  local_1050 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_f88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar70 = ZEXT1664(local_f88);
  local_f98 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar71 = ZEXT1664(local_f98);
  local_fa8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar72 = ZEXT1664(local_fa8);
  local_1028 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_1024 = local_1028;
  uStack_1020 = local_1028;
  uStack_101c = local_1028;
  local_1038 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_1034 = local_1038;
  uStack_1030 = local_1038;
  uStack_102c = local_1038;
  local_1048 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_fb8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * 0.99999964)));
  auVar73 = ZEXT1664(local_fb8);
  local_fc8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 0.99999964)));
  auVar74 = ZEXT1664(local_fc8);
  local_fd8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar75 = ZEXT1664(local_fd8);
  local_fe8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * 1.0000004)));
  auVar76 = ZEXT1664(local_fe8);
  local_ff8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 1.0000004)));
  auVar77 = ZEXT1664(local_ff8);
  local_1008 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 1.0000004)));
  auVar78 = ZEXT1664(local_1008);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1018 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar79 = ZEXT1664(local_1018);
  iVar22 = (tray->tfar).field_0.i[k];
  auVar58 = ZEXT1664(CONCAT412(iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22))));
  local_1058 = ray;
  local_1068 = k;
LAB_01cdf67a:
  do {
    do {
      if (local_1050 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar12 = local_1050 + -1;
      local_1050 = local_1050 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar12 + 8));
    uVar21 = *(size_t *)*local_1050;
    while ((uVar21 & 8) == 0) {
      fVar1 = *(float *)(ray + k * 4 + 0x70);
      uVar13 = (uint)uVar21 & 7;
      uVar18 = uVar21 & 0xfffffffffffffff0;
      auVar26 = auVar70._0_16_;
      auVar27 = auVar71._0_16_;
      auVar40 = auVar72._0_16_;
      if (uVar13 == 3) {
        auVar23 = *(undefined1 (*) [16])(uVar18 + 0x80);
        auVar24 = *(undefined1 (*) [16])(uVar18 + 0x90);
        auVar25 = *(undefined1 (*) [16])(uVar18 + 0xa0);
        auVar63._4_4_ = fVar1;
        auVar63._0_4_ = fVar1;
        auVar63._8_4_ = fVar1;
        auVar63._12_4_ = fVar1;
        fVar2 = 1.0 - fVar1;
        auVar66._4_4_ = fVar2;
        auVar66._0_4_ = fVar2;
        auVar66._8_4_ = fVar2;
        auVar66._12_4_ = fVar2;
        auVar39._0_4_ = fVar1 * *(float *)(uVar18 + 0xe0);
        auVar39._4_4_ = fVar1 * *(float *)(uVar18 + 0xe4);
        auVar39._8_4_ = fVar1 * *(float *)(uVar18 + 0xe8);
        auVar39._12_4_ = fVar1 * *(float *)(uVar18 + 0xec);
        auVar35._0_4_ = fVar1 * *(float *)(uVar18 + 0xf0);
        auVar35._4_4_ = fVar1 * *(float *)(uVar18 + 0xf4);
        auVar35._8_4_ = fVar1 * *(float *)(uVar18 + 0xf8);
        auVar35._12_4_ = fVar1 * *(float *)(uVar18 + 0xfc);
        auVar34._0_4_ = fVar1 * *(float *)(uVar18 + 0x100);
        auVar34._4_4_ = fVar1 * *(float *)(uVar18 + 0x104);
        auVar34._8_4_ = fVar1 * *(float *)(uVar18 + 0x108);
        auVar34._12_4_ = fVar1 * *(float *)(uVar18 + 0x10c);
        auVar28 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar29 = vfmadd231ps_avx512vl(auVar39,auVar66,auVar28);
        auVar30 = vfmadd231ps_avx512vl(auVar35,auVar66,auVar28);
        auVar68._0_4_ = fVar1 * *(float *)(uVar18 + 0x110);
        auVar68._4_4_ = fVar1 * *(float *)(uVar18 + 0x114);
        auVar68._8_4_ = fVar1 * *(float *)(uVar18 + 0x118);
        auVar68._12_4_ = fVar1 * *(float *)(uVar18 + 0x11c);
        auVar31 = vmulps_avx512vl(auVar63,*(undefined1 (*) [16])(uVar18 + 0x120));
        auVar32 = vfmadd231ps_avx512vl(auVar34,auVar66,auVar28);
        auVar64._0_4_ = fVar1 * *(float *)(uVar18 + 0x130);
        auVar64._4_4_ = fVar1 * *(float *)(uVar18 + 0x134);
        auVar64._8_4_ = fVar1 * *(float *)(uVar18 + 0x138);
        auVar64._12_4_ = fVar1 * *(float *)(uVar18 + 0x13c);
        auVar33 = vaddps_avx512vl(auVar66,auVar68);
        auVar34 = vaddps_avx512vl(auVar66,auVar31);
        in_ZMM17 = ZEXT1664(auVar34);
        auVar35 = vaddps_avx512vl(auVar66,auVar64);
        auVar69._0_4_ = local_1048 * auVar23._0_4_;
        auVar69._4_4_ = fStack_1044 * auVar23._4_4_;
        auVar69._8_4_ = fStack_1040 * auVar23._8_4_;
        auVar69._12_4_ = fStack_103c * auVar23._12_4_;
        auVar65._0_4_ = local_1048 * auVar24._0_4_;
        auVar65._4_4_ = fStack_1044 * auVar24._4_4_;
        auVar65._8_4_ = fStack_1040 * auVar24._8_4_;
        auVar65._12_4_ = fStack_103c * auVar24._12_4_;
        auVar67._0_4_ = local_1048 * auVar25._0_4_;
        auVar67._4_4_ = fStack_1044 * auVar25._4_4_;
        auVar67._8_4_ = fStack_1040 * auVar25._8_4_;
        auVar67._12_4_ = fStack_103c * auVar25._12_4_;
        auVar28._4_4_ = uStack_1034;
        auVar28._0_4_ = local_1038;
        auVar28._8_4_ = uStack_1030;
        auVar28._12_4_ = uStack_102c;
        auVar36 = vfmadd231ps_avx512vl(auVar69,auVar28,*(undefined1 (*) [16])(uVar18 + 0x50));
        auVar37 = vfmadd231ps_avx512vl(auVar65,auVar28,*(undefined1 (*) [16])(uVar18 + 0x60));
        auVar28 = vfmadd231ps_avx512vl(auVar67,auVar28,*(undefined1 (*) [16])(uVar18 + 0x70));
        auVar31._4_4_ = uStack_1024;
        auVar31._0_4_ = local_1028;
        auVar31._8_4_ = uStack_1020;
        auVar31._12_4_ = uStack_101c;
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar31,*(undefined1 (*) [16])(uVar18 + 0x20));
        auVar37 = vfmadd231ps_avx512vl(auVar37,auVar31,*(undefined1 (*) [16])(uVar18 + 0x30));
        auVar28 = vfmadd231ps_avx512vl(auVar28,auVar31,*(undefined1 (*) [16])(uVar18 + 0x40));
        auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar38 = vandps_avx512vl(auVar36,auVar31);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar21 = vcmpps_avx512vl(auVar38,auVar39,1);
        bVar6 = (bool)((byte)uVar21 & 1);
        iVar22 = auVar39._0_4_;
        auVar38._0_4_ = (uint)bVar6 * iVar22 | (uint)!bVar6 * auVar36._0_4_;
        bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
        iVar55 = auVar39._4_4_;
        auVar38._4_4_ = (uint)bVar6 * iVar55 | (uint)!bVar6 * auVar36._4_4_;
        bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
        iVar56 = auVar39._8_4_;
        iVar57 = auVar39._12_4_;
        auVar38._8_4_ = (uint)bVar6 * iVar56 | (uint)!bVar6 * auVar36._8_4_;
        bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar6 * iVar57 | (uint)!bVar6 * auVar36._12_4_;
        auVar36 = vandps_avx512vl(auVar37,auVar31);
        uVar21 = vcmpps_avx512vl(auVar36,auVar39,1);
        bVar6 = (bool)((byte)uVar21 & 1);
        auVar36._0_4_ = (uint)bVar6 * iVar22 | (uint)!bVar6 * auVar37._0_4_;
        bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar6 * iVar55 | (uint)!bVar6 * auVar37._4_4_;
        bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar6 * iVar56 | (uint)!bVar6 * auVar37._8_4_;
        bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar6 * iVar57 | (uint)!bVar6 * auVar37._12_4_;
        auVar31 = vandps_avx512vl(auVar28,auVar31);
        uVar21 = vcmpps_avx512vl(auVar31,auVar39,1);
        bVar6 = (bool)((byte)uVar21 & 1);
        auVar37._0_4_ = (uint)bVar6 * iVar22 | (uint)!bVar6 * auVar28._0_4_;
        bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar6 * iVar55 | (uint)!bVar6 * auVar28._4_4_;
        bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar37._8_4_ = (uint)bVar6 * iVar56 | (uint)!bVar6 * auVar28._8_4_;
        bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar37._12_4_ = (uint)bVar6 * iVar57 | (uint)!bVar6 * auVar28._12_4_;
        auVar28 = vrcp14ps_avx512vl(auVar38);
        auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar38 = vfnmadd213ps_avx512vl(auVar38,auVar28,auVar31);
        auVar28 = vfmadd132ps_avx512vl(auVar38,auVar28,auVar28);
        auVar38 = vrcp14ps_avx512vl(auVar36);
        auVar36 = vfnmadd213ps_avx512vl(auVar36,auVar38,auVar31);
        auVar36 = vfmadd132ps_avx512vl(auVar36,auVar38,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar37);
        auVar31 = vfnmadd213ps_avx512vl(auVar37,auVar38,auVar31);
        auVar31 = vfmadd132ps_avx512vl(auVar31,auVar38,auVar38);
        auVar23 = vfmadd213ps_avx512vl(auVar23,auVar40,*(undefined1 (*) [16])(uVar18 + 0xb0));
        auVar23 = vfmadd231ps_avx512vl(auVar23,auVar27,*(undefined1 (*) [16])(uVar18 + 0x50));
        auVar24 = vfmadd213ps_avx512vl(auVar24,auVar40,*(undefined1 (*) [16])(uVar18 + 0xc0));
        auVar24 = vfmadd231ps_avx512vl(auVar24,auVar27,*(undefined1 (*) [16])(uVar18 + 0x60));
        auVar40 = vfmadd213ps_avx512vl(auVar25,auVar40,*(undefined1 (*) [16])(uVar18 + 0xd0));
        auVar27 = vfmadd231ps_avx512vl(auVar40,auVar27,*(undefined1 (*) [16])(uVar18 + 0x70));
        auVar40 = vfmadd231ps_avx512vl(auVar23,auVar26,*(undefined1 (*) [16])(uVar18 + 0x20));
        auVar23 = vfmadd231ps_avx512vl(auVar24,auVar26,*(undefined1 (*) [16])(uVar18 + 0x30));
        auVar24 = vfmadd231ps_avx512vl(auVar27,auVar26,*(undefined1 (*) [16])(uVar18 + 0x40));
        auVar26 = vsubps_avx(auVar29,auVar40);
        auVar25 = vsubps_avx512vl(auVar33,auVar40);
        auVar27 = vsubps_avx(auVar30,auVar23);
        auVar23 = vsubps_avx512vl(auVar34,auVar23);
        auVar40 = vsubps_avx(auVar32,auVar24);
        auVar24 = vsubps_avx512vl(auVar35,auVar24);
        auVar30._0_4_ = auVar28._0_4_ * auVar26._0_4_;
        auVar30._4_4_ = auVar28._4_4_ * auVar26._4_4_;
        auVar30._8_4_ = auVar28._8_4_ * auVar26._8_4_;
        auVar30._12_4_ = auVar28._12_4_ * auVar26._12_4_;
        auVar29._0_4_ = auVar28._0_4_ * auVar25._0_4_;
        auVar29._4_4_ = auVar28._4_4_ * auVar25._4_4_;
        auVar29._8_4_ = auVar28._8_4_ * auVar25._8_4_;
        auVar29._12_4_ = auVar28._12_4_ * auVar25._12_4_;
        auVar32._0_4_ = auVar36._0_4_ * auVar27._0_4_;
        auVar32._4_4_ = auVar36._4_4_ * auVar27._4_4_;
        auVar32._8_4_ = auVar36._8_4_ * auVar27._8_4_;
        auVar32._12_4_ = auVar36._12_4_ * auVar27._12_4_;
        auVar33._0_4_ = auVar31._0_4_ * auVar40._0_4_;
        auVar33._4_4_ = auVar31._4_4_ * auVar40._4_4_;
        auVar33._8_4_ = auVar31._8_4_ * auVar40._8_4_;
        auVar33._12_4_ = auVar31._12_4_ * auVar40._12_4_;
        auVar25._0_4_ = auVar36._0_4_ * auVar23._0_4_;
        auVar25._4_4_ = auVar36._4_4_ * auVar23._4_4_;
        auVar25._8_4_ = auVar36._8_4_ * auVar23._8_4_;
        auVar25._12_4_ = auVar36._12_4_ * auVar23._12_4_;
        auVar23._0_4_ = auVar31._0_4_ * auVar24._0_4_;
        auVar23._4_4_ = auVar31._4_4_ * auVar24._4_4_;
        auVar23._8_4_ = auVar31._8_4_ * auVar24._8_4_;
        auVar23._12_4_ = auVar31._12_4_ * auVar24._12_4_;
        auVar26 = vpminsd_avx(auVar32,auVar25);
        auVar27 = vpminsd_avx(auVar33,auVar23);
        auVar26 = vmaxps_avx(auVar26,auVar27);
        auVar24 = vpminsd_avx(auVar30,auVar29);
        auVar40 = vpmaxsd_avx(auVar30,auVar29);
        auVar27 = vpmaxsd_avx(auVar32,auVar25);
        auVar23 = vpmaxsd_avx(auVar33,auVar23);
        auVar27 = vminps_avx(auVar27,auVar23);
        auVar23 = vmaxps_avx512vl(auVar79._0_16_,auVar24);
        auVar26 = vmaxps_avx(auVar23,auVar26);
        auVar40 = vminps_avx(auVar58._0_16_,auVar40);
        auVar27 = vminps_avx(auVar40,auVar27);
        auVar40._8_4_ = 0x3f7ffffa;
        auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
        auVar40._12_4_ = 0x3f7ffffa;
        local_1088 = vmulps_avx512vl(auVar26,auVar40);
        auVar26._8_4_ = 0x3f800003;
        auVar26._0_8_ = 0x3f8000033f800003;
        auVar26._12_4_ = 0x3f800003;
        auVar26 = vmulps_avx512vl(auVar27,auVar26);
        uVar8 = vcmpps_avx512vl(local_1088,auVar26,2);
        uVar20 = (uint)uVar8;
      }
      else {
        auVar59._4_4_ = fVar1;
        auVar59._0_4_ = fVar1;
        auVar59._8_4_ = fVar1;
        auVar59._12_4_ = fVar1;
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar16),auVar59,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar16));
        auVar23 = vsubps_avx512vl(auVar23,auVar26);
        auVar24 = vmulps_avx512vl(auVar73._0_16_,auVar23);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar19),auVar59,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar19));
        auVar23 = vsubps_avx512vl(auVar23,auVar27);
        auVar25 = vmulps_avx512vl(auVar74._0_16_,auVar23);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar17),auVar59,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar17));
        auVar23 = vsubps_avx512vl(auVar23,auVar40);
        auVar23 = vmulps_avx512vl(auVar75._0_16_,auVar23);
        auVar23 = vmaxps_avx(auVar25,auVar23);
        auVar24 = vmaxps_avx512vl(auVar79._0_16_,auVar24);
        local_1088 = vmaxps_avx(auVar24,auVar23);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar16 ^ 0x10)),auVar59,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar16 ^ 0x10)));
        auVar26 = vsubps_avx512vl(auVar23,auVar26);
        auVar23 = vmulps_avx512vl(auVar76._0_16_,auVar26);
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar19 ^ 0x10)),auVar59,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar19 ^ 0x10)));
        auVar26 = vsubps_avx512vl(auVar26,auVar27);
        auVar27 = vmulps_avx512vl(auVar77._0_16_,auVar26);
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar17 ^ 0x10)),auVar59,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar17 ^ 0x10)));
        auVar26 = vsubps_avx512vl(auVar26,auVar40);
        auVar26 = vmulps_avx512vl(auVar78._0_16_,auVar26);
        auVar26 = vminps_avx(auVar27,auVar26);
        auVar27 = vminps_avx(auVar58._0_16_,auVar23);
        auVar26 = vminps_avx(auVar27,auVar26);
        uVar8 = vcmpps_avx512vl(local_1088,auVar26,2);
        uVar20 = (uint)uVar8;
        if (uVar13 == 6) {
          uVar9 = vcmpps_avx512vl(auVar59,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
          uVar10 = vcmpps_avx512vl(auVar59,*(undefined1 (*) [16])(uVar18 + 0xe0),0xd);
          uVar20 = (uint)(byte)((byte)uVar9 & (byte)uVar10 & (byte)uVar8);
        }
      }
      if ((byte)uVar20 == 0) goto LAB_01cdf67a;
      lVar11 = 0;
      for (uVar21 = (ulong)(byte)uVar20; (uVar21 & 1) == 0;
          uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar21 = *(ulong *)(uVar18 + lVar11 * 8);
      uVar13 = (uVar20 & 0xff) - 1 & uVar20 & 0xff;
      uVar14 = (ulong)uVar13;
      if (uVar13 != 0) {
        uVar20 = *(uint *)(local_1088 + lVar11 * 4);
        lVar11 = 0;
        for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar13 = uVar13 - 1 & uVar13;
        uVar15 = (ulong)uVar13;
        uVar14 = *(ulong *)(uVar18 + lVar11 * 8);
        uVar5 = *(uint *)(local_1088 + lVar11 * 4);
        if (uVar13 == 0) {
          if (uVar20 < uVar5) {
            *(ulong *)*local_1050 = uVar14;
            *(uint *)((long)*local_1050 + 8) = uVar5;
            local_1050 = local_1050 + 1;
          }
          else {
            *(ulong *)*local_1050 = uVar21;
            *(uint *)((long)*local_1050 + 8) = uVar20;
            uVar21 = uVar14;
            local_1050 = local_1050 + 1;
          }
        }
        else {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar21;
          auVar26 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar20));
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar14;
          auVar27 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar5));
          lVar11 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar21 = (ulong)uVar13;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(uVar18 + lVar11 * 8);
          auVar25 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_1088 + lVar11 * 4)));
          auVar40 = vpshufd_avx(auVar26,0xaa);
          auVar23 = vpshufd_avx(auVar27,0xaa);
          auVar24 = vpshufd_avx(auVar25,0xaa);
          if (uVar13 == 0) {
            uVar21 = vpcmpgtd_avx512vl(auVar23,auVar40);
            uVar21 = uVar21 & 0xf;
            auVar23 = vpblendmd_avx512vl(auVar27,auVar26);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar41._0_4_ = (uint)bVar6 * auVar23._0_4_ | (uint)!bVar6 * auVar40._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar41._4_4_ = (uint)bVar6 * auVar23._4_4_ | (uint)!bVar6 * auVar40._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar41._8_4_ = (uint)bVar6 * auVar23._8_4_ | (uint)!bVar6 * auVar40._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar41._12_4_ = (uint)bVar6 * auVar23._12_4_ | (uint)!bVar6 * auVar40._12_4_;
            auVar27 = vmovdqa32_avx512vl(auVar27);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar42._0_4_ = (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar42._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar42._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar42._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
            auVar26 = vpshufd_avx(auVar41,0xaa);
            uVar18 = vpcmpgtd_avx512vl(auVar24,auVar26);
            uVar18 = uVar18 & 0xf;
            auVar27 = vpblendmd_avx512vl(auVar25,auVar41);
            bVar6 = (bool)((byte)uVar18 & 1);
            bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
            uVar21 = CONCAT44((uint)bVar7 * auVar27._4_4_ | (uint)!bVar7 * auVar26._4_4_,
                              (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_);
            auVar26 = vmovdqa32_avx512vl(auVar25);
            bVar6 = (bool)((byte)uVar18 & 1);
            auVar43._0_4_ = (uint)bVar6 * auVar26._0_4_ | !bVar6 * auVar41._0_4_;
            bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
            auVar43._4_4_ = (uint)bVar6 * auVar26._4_4_ | !bVar6 * auVar41._4_4_;
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            auVar43._8_4_ = (uint)bVar6 * auVar26._8_4_ | !bVar6 * auVar41._8_4_;
            bVar6 = SUB81(uVar18 >> 3,0);
            auVar43._12_4_ = (uint)bVar6 * auVar26._12_4_ | !bVar6 * auVar41._12_4_;
            auVar26 = vpshufd_avx(auVar43,0xaa);
            auVar27 = vpshufd_avx(auVar42,0xaa);
            uVar18 = vpcmpgtd_avx512vl(auVar26,auVar27);
            uVar18 = uVar18 & 0xf;
            auVar27 = vpblendmd_avx512vl(auVar43,auVar42);
            bVar6 = (bool)((byte)uVar18 & 1);
            auVar44._0_4_ = (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_;
            bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
            bVar6 = SUB81(uVar18 >> 3,0);
            auVar44._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
            auVar26 = vmovdqa32_avx512vl(auVar43);
            bVar6 = (bool)((byte)uVar18 & 1);
            auVar45._0_4_ = (uint)bVar6 * auVar26._0_4_ | !bVar6 * auVar42._0_4_;
            bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar6 * auVar26._4_4_ | !bVar6 * auVar42._4_4_;
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar6 * auVar26._8_4_ | !bVar6 * auVar42._8_4_;
            bVar6 = SUB81(uVar18 >> 3,0);
            auVar45._12_4_ = (uint)bVar6 * auVar26._12_4_ | !bVar6 * auVar42._12_4_;
            *local_1050 = auVar45;
            local_1050[1] = auVar44;
            local_1050 = local_1050 + 2;
          }
          else {
            lVar11 = 0;
            for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar13 = *(uint *)(local_1088 + lVar11 * 4);
            auVar62._8_8_ = 0;
            auVar62._0_8_ = *(ulong *)(uVar18 + lVar11 * 8);
            auVar28 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar13));
            uVar21 = vpcmpgtd_avx512vl(auVar23,auVar40);
            uVar21 = uVar21 & 0xf;
            auVar23 = vpblendmd_avx512vl(auVar27,auVar26);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar46._0_4_ = (uint)bVar6 * auVar23._0_4_ | (uint)!bVar6 * auVar40._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar6 * auVar23._4_4_ | (uint)!bVar6 * auVar40._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar6 * auVar23._8_4_ | (uint)!bVar6 * auVar40._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar46._12_4_ = (uint)bVar6 * auVar23._12_4_ | (uint)!bVar6 * auVar40._12_4_;
            auVar27 = vmovdqa32_avx512vl(auVar27);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar47._0_4_ = (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar47._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
            auVar61._4_4_ = uVar13;
            auVar61._0_4_ = uVar13;
            auVar61._8_4_ = uVar13;
            auVar61._12_4_ = uVar13;
            uVar21 = vpcmpgtd_avx512vl(auVar61,auVar24);
            uVar21 = uVar21 & 0xf;
            auVar26 = vpblendmd_avx512vl(auVar28,auVar25);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar48._0_4_ = (uint)bVar6 * auVar26._0_4_ | !bVar6 * uVar13;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar6 * auVar26._4_4_ | !bVar6 * uVar13;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar6 * auVar26._8_4_ | !bVar6 * uVar13;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar48._12_4_ = (uint)bVar6 * auVar26._12_4_ | !bVar6 * uVar13;
            auVar26 = vmovdqa32_avx512vl(auVar28);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar49._0_4_ = (uint)bVar6 * auVar26._0_4_ | (uint)!bVar6 * auVar25._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar6 * auVar26._4_4_ | (uint)!bVar6 * auVar25._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar6 * auVar26._8_4_ | (uint)!bVar6 * auVar25._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar49._12_4_ = (uint)bVar6 * auVar26._12_4_ | (uint)!bVar6 * auVar25._12_4_;
            auVar26 = vpshufd_avx(auVar49,0xaa);
            auVar27 = vpshufd_avx(auVar47,0xaa);
            uVar21 = vpcmpgtd_avx512vl(auVar26,auVar27);
            uVar21 = uVar21 & 0xf;
            auVar27 = vpblendmd_avx512vl(auVar49,auVar47);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar50._0_4_ = (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar50._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
            auVar26 = vmovdqa32_avx512vl(auVar49);
            bVar6 = (bool)((byte)uVar21 & 1);
            auVar51._0_4_ = (uint)bVar6 * auVar26._0_4_ | !bVar6 * auVar47._0_4_;
            bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar6 * auVar26._4_4_ | !bVar6 * auVar47._4_4_;
            bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar6 * auVar26._8_4_ | !bVar6 * auVar47._8_4_;
            bVar6 = SUB81(uVar21 >> 3,0);
            auVar51._12_4_ = (uint)bVar6 * auVar26._12_4_ | !bVar6 * auVar47._12_4_;
            auVar26 = vpshufd_avx(auVar48,0xaa);
            auVar27 = vpshufd_avx(auVar46,0xaa);
            uVar18 = vpcmpgtd_avx512vl(auVar26,auVar27);
            uVar18 = uVar18 & 0xf;
            auVar27 = vpblendmd_avx512vl(auVar48,auVar46);
            bVar6 = (bool)((byte)uVar18 & 1);
            bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
            uVar21 = CONCAT44((uint)bVar7 * auVar27._4_4_ | (uint)!bVar7 * auVar26._4_4_,
                              (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_);
            auVar26 = vmovdqa32_avx512vl(auVar48);
            bVar6 = (bool)((byte)uVar18 & 1);
            auVar52._0_4_ = (uint)bVar6 * auVar26._0_4_ | !bVar6 * auVar46._0_4_;
            bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar6 * auVar26._4_4_ | !bVar6 * auVar46._4_4_;
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar6 * auVar26._8_4_ | !bVar6 * auVar46._8_4_;
            bVar6 = SUB81(uVar18 >> 3,0);
            auVar52._12_4_ = (uint)bVar6 * auVar26._12_4_ | !bVar6 * auVar46._12_4_;
            auVar26 = vpshufd_avx(auVar52,0xaa);
            auVar27 = vpshufd_avx(auVar50,0xaa);
            uVar18 = vpcmpgtd_avx512vl(auVar27,auVar26);
            uVar18 = uVar18 & 0xf;
            auVar27 = vpblendmd_avx512vl(auVar50,auVar52);
            bVar6 = (bool)((byte)uVar18 & 1);
            auVar53._0_4_ = (uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_;
            bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
            bVar6 = SUB81(uVar18 >> 3,0);
            auVar53._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
            auVar26 = vmovdqa32_avx512vl(auVar50);
            bVar6 = (bool)((byte)uVar18 & 1);
            auVar54._0_4_ = (uint)bVar6 * auVar26._0_4_ | !bVar6 * auVar52._0_4_;
            bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar6 * auVar26._4_4_ | !bVar6 * auVar52._4_4_;
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar6 * auVar26._8_4_ | !bVar6 * auVar52._8_4_;
            bVar6 = SUB81(uVar18 >> 3,0);
            auVar54._12_4_ = (uint)bVar6 * auVar26._12_4_ | !bVar6 * auVar52._12_4_;
            *local_1050 = auVar51;
            local_1050[1] = auVar54;
            local_1050[2] = auVar53;
            local_1050 = local_1050 + 3;
          }
        }
      }
    }
    (**(code **)((long)local_1070->leafIntersector +
                (ulong)*(byte *)(uVar21 & 0xfffffffffffffff0) * 0x40 + 0x10))
              (local_1060,ray,k,context);
    auVar79 = ZEXT1664(local_1018);
    auVar78 = ZEXT1664(local_1008);
    auVar77 = ZEXT1664(local_ff8);
    auVar76 = ZEXT1664(local_fe8);
    auVar75 = ZEXT1664(local_fd8);
    auVar74 = ZEXT1664(local_fc8);
    auVar73 = ZEXT1664(local_fb8);
    auVar72 = ZEXT1664(local_fa8);
    auVar71 = ZEXT1664(local_f98);
    auVar70 = ZEXT1664(local_f88);
    uVar4 = *(undefined4 *)(local_1058 + local_1068 * 4 + 0x80);
    auVar58 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
    ray = local_1058;
    k = local_1068;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }